

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void getPixelColorsRGBA8(uchar *buffer,size_t numpixels,uint has_alpha,uchar *in,
                        LodePNGColorMode *mode)

{
  uchar uVar1;
  undefined1 uVar2;
  bool bVar3;
  size_t local_60;
  size_t j_1;
  uint index;
  uint value;
  size_t j;
  size_t sStack_40;
  uint highest;
  size_t i;
  LodePNGColorMode *pLStack_30;
  uint num_channels;
  LodePNGColorMode *mode_local;
  uchar *in_local;
  size_t sStack_18;
  uint has_alpha_local;
  size_t numpixels_local;
  uchar *buffer_local;
  
  i._4_4_ = 3;
  if (has_alpha != 0) {
    i._4_4_ = 4;
  }
  pLStack_30 = mode;
  mode_local = (LodePNGColorMode *)in;
  in_local._4_4_ = has_alpha;
  sStack_18 = numpixels;
  numpixels_local = (size_t)buffer;
  if (mode->colortype == LCT_GREY) {
    if (mode->bitdepth == 8) {
      for (sStack_40 = 0; sStack_40 != numpixels; sStack_40 = sStack_40 + 1) {
        uVar1 = in[sStack_40];
        *(uchar *)(numpixels_local + 2) = uVar1;
        *(uchar *)(numpixels_local + 1) = uVar1;
        *(uchar *)numpixels_local = uVar1;
        if (has_alpha != 0) {
          bVar3 = false;
          if (mode->key_defined != 0) {
            bVar3 = (uint)in[sStack_40] == mode->key_r;
          }
          uVar2 = 0xff;
          if (bVar3) {
            uVar2 = 0;
          }
          *(undefined1 *)(numpixels_local + 3) = uVar2;
        }
        numpixels_local = numpixels_local + i._4_4_;
      }
    }
    else if (mode->bitdepth == 0x10) {
      for (sStack_40 = 0; sStack_40 != numpixels; sStack_40 = sStack_40 + 1) {
        uVar1 = in[sStack_40 * 2];
        *(uchar *)(numpixels_local + 2) = uVar1;
        *(uchar *)(numpixels_local + 1) = uVar1;
        *(uchar *)numpixels_local = uVar1;
        if (has_alpha != 0) {
          bVar3 = false;
          if (mode->key_defined != 0) {
            bVar3 = (uint)in[sStack_40 * 2] * 0x100 + (uint)in[sStack_40 * 2 + 1] == mode->key_r;
          }
          uVar2 = 0xff;
          if (bVar3) {
            uVar2 = 0;
          }
          *(undefined1 *)(numpixels_local + 3) = uVar2;
        }
        numpixels_local = numpixels_local + i._4_4_;
      }
    }
    else {
      j._4_4_ = (1 << ((byte)mode->bitdepth & 0x1f)) - 1;
      _index = 0;
      for (sStack_40 = 0; sStack_40 != sStack_18; sStack_40 = sStack_40 + 1) {
        j_1._4_4_ = readBitsFromReversedStream
                              ((size_t *)&index,(uchar *)mode_local,(ulong)pLStack_30->bitdepth);
        uVar2 = (undefined1)((j_1._4_4_ * 0xff) / j._4_4_);
        *(undefined1 *)(numpixels_local + 2) = uVar2;
        *(undefined1 *)(numpixels_local + 1) = uVar2;
        *(undefined1 *)numpixels_local = uVar2;
        if (in_local._4_4_ != 0) {
          bVar3 = false;
          if (pLStack_30->key_defined != 0) {
            bVar3 = j_1._4_4_ == pLStack_30->key_r;
          }
          uVar2 = 0xff;
          if (bVar3) {
            uVar2 = 0;
          }
          *(undefined1 *)(numpixels_local + 3) = uVar2;
        }
        numpixels_local = numpixels_local + i._4_4_;
      }
    }
  }
  else if (mode->colortype == LCT_RGB) {
    if (mode->bitdepth == 8) {
      for (sStack_40 = 0; sStack_40 != numpixels; sStack_40 = sStack_40 + 1) {
        *(uchar *)numpixels_local = in[sStack_40 * 3];
        *(uchar *)(numpixels_local + 1) = in[sStack_40 * 3 + 1];
        *(uchar *)(numpixels_local + 2) = in[sStack_40 * 3 + 2];
        if (has_alpha != 0) {
          bVar3 = false;
          if (((mode->key_defined != 0) &&
              (bVar3 = false, (uint)*(byte *)numpixels_local == mode->key_r)) &&
             (bVar3 = false, (uint)*(byte *)(numpixels_local + 1) == mode->key_g)) {
            bVar3 = (uint)*(byte *)(numpixels_local + 2) == mode->key_b;
          }
          uVar2 = 0xff;
          if (bVar3) {
            uVar2 = 0;
          }
          *(undefined1 *)(numpixels_local + 3) = uVar2;
        }
        numpixels_local = numpixels_local + i._4_4_;
      }
    }
    else {
      for (sStack_40 = 0; sStack_40 != numpixels; sStack_40 = sStack_40 + 1) {
        *(uchar *)numpixels_local = in[sStack_40 * 6];
        *(uchar *)(numpixels_local + 1) = in[sStack_40 * 6 + 2];
        *(uchar *)(numpixels_local + 2) = in[sStack_40 * 6 + 4];
        if (has_alpha != 0) {
          bVar3 = false;
          if (((mode->key_defined != 0) &&
              (bVar3 = false,
              (uint)in[sStack_40 * 6] * 0x100 + (uint)in[sStack_40 * 6 + 1] == mode->key_r)) &&
             (bVar3 = false,
             (uint)in[sStack_40 * 6 + 2] * 0x100 + (uint)in[sStack_40 * 6 + 3] == mode->key_g)) {
            bVar3 = (uint)in[sStack_40 * 6 + 4] * 0x100 + (uint)in[sStack_40 * 6 + 5] == mode->key_b
            ;
          }
          uVar2 = 0xff;
          if (bVar3) {
            uVar2 = 0;
          }
          *(undefined1 *)(numpixels_local + 3) = uVar2;
        }
        numpixels_local = numpixels_local + i._4_4_;
      }
    }
  }
  else if (mode->colortype == LCT_PALETTE) {
    local_60 = 0;
    for (sStack_40 = 0; sStack_40 != sStack_18; sStack_40 = sStack_40 + 1) {
      if (pLStack_30->bitdepth == 8) {
        j_1._0_4_ = (uint)*(byte *)((long)&mode_local->colortype + sStack_40);
      }
      else {
        j_1._0_4_ = readBitsFromReversedStream
                              (&local_60,(uchar *)mode_local,(ulong)pLStack_30->bitdepth);
      }
      if ((ulong)(uint)j_1 < pLStack_30->palettesize) {
        *(uchar *)numpixels_local = pLStack_30->palette[(uint)j_1 << 2];
        *(uchar *)(numpixels_local + 1) = pLStack_30->palette[(uint)j_1 * 4 + 1];
        *(uchar *)(numpixels_local + 2) = pLStack_30->palette[(uint)j_1 * 4 + 2];
        if (in_local._4_4_ != 0) {
          *(uchar *)(numpixels_local + 3) = pLStack_30->palette[(uint)j_1 * 4 + 3];
        }
      }
      else {
        *(undefined1 *)(numpixels_local + 2) = 0;
        *(undefined1 *)(numpixels_local + 1) = 0;
        *(undefined1 *)numpixels_local = 0;
        if (in_local._4_4_ != 0) {
          *(undefined1 *)(numpixels_local + 3) = 0xff;
        }
      }
      numpixels_local = numpixels_local + i._4_4_;
    }
  }
  else if (mode->colortype == LCT_GREY_ALPHA) {
    if (mode->bitdepth == 8) {
      for (sStack_40 = 0; sStack_40 != numpixels; sStack_40 = sStack_40 + 1) {
        uVar1 = in[sStack_40 * 2];
        *(uchar *)(numpixels_local + 2) = uVar1;
        *(uchar *)(numpixels_local + 1) = uVar1;
        *(uchar *)numpixels_local = uVar1;
        if (has_alpha != 0) {
          *(uchar *)(numpixels_local + 3) = in[sStack_40 * 2 + 1];
        }
        numpixels_local = numpixels_local + i._4_4_;
      }
    }
    else {
      for (sStack_40 = 0; sStack_40 != numpixels; sStack_40 = sStack_40 + 1) {
        uVar1 = in[sStack_40 * 4];
        *(uchar *)(numpixels_local + 2) = uVar1;
        *(uchar *)(numpixels_local + 1) = uVar1;
        *(uchar *)numpixels_local = uVar1;
        if (has_alpha != 0) {
          *(uchar *)(numpixels_local + 3) = in[sStack_40 * 4 + 2];
        }
        numpixels_local = numpixels_local + i._4_4_;
      }
    }
  }
  else if (mode->colortype == LCT_RGBA) {
    if (mode->bitdepth == 8) {
      for (sStack_40 = 0; sStack_40 != numpixels; sStack_40 = sStack_40 + 1) {
        *(uchar *)numpixels_local = in[sStack_40 * 4];
        *(uchar *)(numpixels_local + 1) = in[sStack_40 * 4 + 1];
        *(uchar *)(numpixels_local + 2) = in[sStack_40 * 4 + 2];
        if (has_alpha != 0) {
          *(uchar *)(numpixels_local + 3) = in[sStack_40 * 4 + 3];
        }
        numpixels_local = numpixels_local + i._4_4_;
      }
    }
    else {
      for (sStack_40 = 0; sStack_40 != numpixels; sStack_40 = sStack_40 + 1) {
        *(uchar *)numpixels_local = in[sStack_40 * 8];
        *(uchar *)(numpixels_local + 1) = in[sStack_40 * 8 + 2];
        *(uchar *)(numpixels_local + 2) = in[sStack_40 * 8 + 4];
        if (has_alpha != 0) {
          *(uchar *)(numpixels_local + 3) = in[sStack_40 * 8 + 6];
        }
        numpixels_local = numpixels_local + i._4_4_;
      }
    }
  }
  return;
}

Assistant:

static void getPixelColorsRGBA8(unsigned char* buffer, size_t numpixels,
                                unsigned has_alpha, const unsigned char* in,
                                const LodePNGColorMode* mode)
{
  unsigned num_channels = has_alpha ? 4 : 3;
  size_t i;
  if(mode->colortype == LCT_GREY)
  {
    if(mode->bitdepth == 8)
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = buffer[1] = buffer[2] = in[i];
        if(has_alpha) buffer[3] = mode->key_defined && in[i] == mode->key_r ? 0 : 255;
      }
    }
    else if(mode->bitdepth == 16)
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = buffer[1] = buffer[2] = in[i * 2];
        if(has_alpha) buffer[3] = mode->key_defined && 256U * in[i * 2 + 0] + in[i * 2 + 1] == mode->key_r ? 0 : 255;
      }
    }
    else
    {
      unsigned highest = ((1U << mode->bitdepth) - 1U); /*highest possible value for this bit depth*/
      size_t j = 0;
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        unsigned value = readBitsFromReversedStream(&j, in, mode->bitdepth);
        buffer[0] = buffer[1] = buffer[2] = (value * 255) / highest;
        if(has_alpha) buffer[3] = mode->key_defined && value == mode->key_r ? 0 : 255;
      }
    }
  }
  else if(mode->colortype == LCT_RGB)
  {
    if(mode->bitdepth == 8)
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = in[i * 3 + 0];
        buffer[1] = in[i * 3 + 1];
        buffer[2] = in[i * 3 + 2];
        if(has_alpha) buffer[3] = mode->key_defined && buffer[0] == mode->key_r
           && buffer[1]== mode->key_g && buffer[2] == mode->key_b ? 0 : 255;
      }
    }
    else
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = in[i * 6 + 0];
        buffer[1] = in[i * 6 + 2];
        buffer[2] = in[i * 6 + 4];
        if(has_alpha) buffer[3] = mode->key_defined
           && 256U * in[i * 6 + 0] + in[i * 6 + 1] == mode->key_r
           && 256U * in[i * 6 + 2] + in[i * 6 + 3] == mode->key_g
           && 256U * in[i * 6 + 4] + in[i * 6 + 5] == mode->key_b ? 0 : 255;
      }
    }
  }
  else if(mode->colortype == LCT_PALETTE)
  {
    unsigned index;
    size_t j = 0;
    for(i = 0; i != numpixels; ++i, buffer += num_channels)
    {
      if(mode->bitdepth == 8) index = in[i];
      else index = readBitsFromReversedStream(&j, in, mode->bitdepth);

      if(index >= mode->palettesize)
      {
        /*This is an error according to the PNG spec, but most PNG decoders make it black instead.
        Done here too, slightly faster due to no error handling needed.*/
        buffer[0] = buffer[1] = buffer[2] = 0;
        if(has_alpha) buffer[3] = 255;
      }
      else
      {
        buffer[0] = mode->palette[index * 4 + 0];
        buffer[1] = mode->palette[index * 4 + 1];
        buffer[2] = mode->palette[index * 4 + 2];
        if(has_alpha) buffer[3] = mode->palette[index * 4 + 3];
      }
    }
  }
  else if(mode->colortype == LCT_GREY_ALPHA)
  {
    if(mode->bitdepth == 8)
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = buffer[1] = buffer[2] = in[i * 2 + 0];
        if(has_alpha) buffer[3] = in[i * 2 + 1];
      }
    }
    else
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = buffer[1] = buffer[2] = in[i * 4 + 0];
        if(has_alpha) buffer[3] = in[i * 4 + 2];
      }
    }
  }
  else if(mode->colortype == LCT_RGBA)
  {
    if(mode->bitdepth == 8)
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = in[i * 4 + 0];
        buffer[1] = in[i * 4 + 1];
        buffer[2] = in[i * 4 + 2];
        if(has_alpha) buffer[3] = in[i * 4 + 3];
      }
    }
    else
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = in[i * 8 + 0];
        buffer[1] = in[i * 8 + 2];
        buffer[2] = in[i * 8 + 4];
        if(has_alpha) buffer[3] = in[i * 8 + 6];
      }
    }
  }
}